

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# personal_settings.cpp
# Opt level: O3

void __thiscall
PersonalSettings::PersonalSettings
          (PersonalSettings *this,ArgumentDictionary *args,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
          *item_names)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  bool bVar3;
  Color CVar4;
  ostream *poVar5;
  pair<Color,_Color> pVar6;
  Json settings_json;
  string settings_path;
  ifstream personal_settings_file;
  undefined1 local_2b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  string local_278;
  string local_258;
  string local_238;
  byte abStack_218 [488];
  
  p_Var1 = &(this->_item_names)._M_t._M_impl.super__Rb_tree_header;
  (this->_item_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_item_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_item_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_item_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_item_names)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_add_ingame_item_tracker = false;
  Color::Color(&this->_hud_color,'@',' ',0x80);
  Color::Color((Color *)&local_238,'\0',0xa0,0x80);
  Color::Color((Color *)&local_258,'\0','@',' ');
  pVar6.second = local_258._M_dataplus._M_p._0_4_;
  pVar6.first = local_238._M_dataplus._M_p._0_4_;
  this->_nigel_colors = pVar6;
  this->_remove_music = false;
  this->_swap_overworld_music = false;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
               *)this,&item_names->_M_t);
  (this->_inventory_order)._M_elems[0x10] = '8';
  (this->_inventory_order)._M_elems[0x11] = '9';
  (this->_inventory_order)._M_elems[0x12] = ',';
  (this->_inventory_order)._M_elems[0x13] = '\x16';
  (this->_inventory_order)._M_elems[0x14] = '6';
  (this->_inventory_order)._M_elems[0x15] = ')';
  (this->_inventory_order)._M_elems[0x16] = '0';
  (this->_inventory_order)._M_elems[0x17] = '\'';
  (this->_inventory_order)._M_elems[0x18] = '(';
  (this->_inventory_order)._M_elems[0x19] = '*';
  (this->_inventory_order)._M_elems[0x1a] = '4';
  (this->_inventory_order)._M_elems[0x1b] = '!';
  (this->_inventory_order)._M_elems[0x1c] = '\"';
  (this->_inventory_order)._M_elems[0x1d] = '3';
  (this->_inventory_order)._M_elems[0x1e] = '\x17';
  (this->_inventory_order)._M_elems[0x1f] = '\x1f';
  (this->_inventory_order)._M_elems[0] = '#';
  (this->_inventory_order)._M_elems[1] = '$';
  (this->_inventory_order)._M_elems[2] = '\0';
  (this->_inventory_order)._M_elems[3] = '-';
  (this->_inventory_order)._M_elems[4] = '\x14';
  (this->_inventory_order)._M_elems[5] = '\x13';
  (this->_inventory_order)._M_elems[6] = '.';
  (this->_inventory_order)._M_elems[7] = '\x12';
  (this->_inventory_order)._M_elems[8] = '\x15';
  (this->_inventory_order)._M_elems[9] = '\x1c';
  (this->_inventory_order)._M_elems[10] = '2';
  (this->_inventory_order)._M_elems[0xb] = '1';
  (this->_inventory_order)._M_elems[0xc] = '\x1b';
  (this->_inventory_order)._M_elems[0xd] = '/';
  (this->_inventory_order)._M_elems[0xe] = '+';
  (this->_inventory_order)._M_elems[0xf] = '7';
  (this->_inventory_order)._M_elems[0x20] = '\x1e';
  (this->_inventory_order)._M_elems[0x21] = '\x19';
  (this->_inventory_order)._M_elems[0x22] = '\x1a';
  (this->_inventory_order)._M_elems[0x23] = ' ';
  (this->_inventory_order)._M_elems[0x24] = '\x1d';
  (this->_inventory_order)._M_elems[0x25] = '5';
  (this->_inventory_order)._M_elems[0x26] = '\x18';
  (this->_inventory_order)._M_elems[0x27] = 0xff;
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"personalsettings","");
  psVar2 = (string *)(local_2b8 + 0x10);
  local_2b8._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"");
  ArgumentDictionary::get_string(&local_258,args,&local_238,(string *)local_2b8);
  if ((string *)local_2b8._0_8_ != psVar2) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if (local_258._M_string_length == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_258,0,0,"./personal_settings.json",0x18);
  }
  std::ifstream::ifstream(&local_238,(string *)&local_258,_S_in);
  if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Personal settings: \'",0x14);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        (char *)CONCAT44(local_258._M_dataplus._M_p._4_4_,
                                         local_258._M_dataplus._M_p._0_4_),
                        local_258._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
    local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffffffffff00;
    local_2b8._8_8_ = (object_t *)0x0;
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_2b8,true);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_2b8,true);
    nlohmann::operator>>
              ((istream *)&local_238,
               (basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_2b8);
    parse_json(this,(Json *)local_2b8);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_2b8);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Could not open \'",0x10);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        (char *)CONCAT44(local_258._M_dataplus._M_p._4_4_,
                                         local_258._M_dataplus._M_p._0_4_),
                        local_258._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\', will use default values.\n",0x1c)
    ;
  }
  local_2b8._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"ingametracker","");
  bVar3 = ArgumentDictionary::contains(args,(string *)local_2b8);
  if ((string *)local_2b8._0_8_ != psVar2) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  if (bVar3) {
    local_2b8._0_8_ = psVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"ingametracker","");
    bVar3 = ArgumentDictionary::get_boolean(args,(string *)local_2b8,false);
    this->_add_ingame_item_tracker = bVar3;
    if ((string *)local_2b8._0_8_ != psVar2) {
      operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
    }
  }
  local_2b8._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"hudcolor","");
  bVar3 = ArgumentDictionary::contains(args,(string *)local_2b8);
  if ((string *)local_2b8._0_8_ != psVar2) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  if (bVar3) {
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"hudcolor","");
    local_298._M_allocated_capacity = (size_type)&local_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"");
    ArgumentDictionary::get_string((string *)local_2b8,args,&local_278,(string *)&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_allocated_capacity != &local_288) {
      operator_delete((void *)local_298._M_allocated_capacity,local_288._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    CVar4 = parse_color_from_name_or_hex((string *)local_2b8._0_8_);
    this->_hud_color = CVar4;
    if ((string *)local_2b8._0_8_ != psVar2) {
      operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
    }
  }
  local_2b8._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"nigelcolor","");
  bVar3 = ArgumentDictionary::contains(args,(string *)local_2b8);
  if ((string *)local_2b8._0_8_ != psVar2) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  if (bVar3) {
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"nigelcolor","");
    local_298._M_allocated_capacity = (size_type)&local_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"");
    ArgumentDictionary::get_string((string *)local_2b8,args,&local_278,(string *)&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_allocated_capacity != &local_288) {
      operator_delete((void *)local_298._M_allocated_capacity,local_288._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    CVar4 = parse_color_from_name_or_hex((string *)local_2b8._0_8_);
    (this->_nigel_colors).first = CVar4;
    CVar4 = Color::subtract(&(this->_nigel_colors).first,'@');
    (this->_nigel_colors).second = CVar4;
    if ((string *)local_2b8._0_8_ != psVar2) {
      operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
    }
  }
  std::ifstream::~ifstream(&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_258._M_dataplus._M_p._4_4_,local_258._M_dataplus._M_p._0_4_) !=
      &local_258.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_258._M_dataplus._M_p._4_4_,local_258._M_dataplus._M_p._0_4_),
                    local_258.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

PersonalSettings::PersonalSettings(const ArgumentDictionary& args, const std::map<std::string, uint8_t>& item_names)
{
    _item_names = item_names;

    _inventory_order = {
            ITEM_RECORD_BOOK,   ITEM_SPELL_BOOK,
            ITEM_EKEEKE,        ITEM_DAHL,
            ITEM_GOLDEN_STATUE, ITEM_GAIA_STATUE,
            ITEM_RESTORATION,   ITEM_DETOX_GRASS,
            ITEM_MIND_REPAIR,   ITEM_ANTI_PARALYZE,
            ITEM_KEY,           ITEM_IDOL_STONE,
            ITEM_GARLIC,        ITEM_LOGS,
            ITEM_GOLA_EYE,      ITEM_GOLA_NAIL,
            ITEM_GOLA_HORN,     ITEM_GOLA_FANG,
            ITEM_DEATH_STATUE,  ITEM_CASINO_TICKET,
            ITEM_SHORT_CAKE,    ITEM_PAWN_TICKET,
            ITEM_ORACLE_STONE,  ITEM_LITHOGRAPH,
            ITEM_RED_JEWEL,     ITEM_PURPLE_JEWEL,
            ITEM_GREEN_JEWEL,   ITEM_BLUE_JEWEL,
            ITEM_YELLOW_JEWEL,  ITEM_SAFETY_PASS,
            ITEM_AXE_MAGIC,     ITEM_ARMLET,
            ITEM_SUN_STONE,     ITEM_BUYER_CARD,
            ITEM_LANTERN,       ITEM_EINSTEIN_WHISTLE,
            ITEM_STATUE_JYPTA,  ITEM_BELL,
            ITEM_BLUE_RIBBON,   0xFF
    };

    // Read settings from personal_settings.json file is it's present
    std::string settings_path = args.get_string("personalsettings");
    if(settings_path.empty())
        settings_path = "./personal_settings.json";

    std::ifstream personal_settings_file(settings_path);
    if(personal_settings_file)
    {
        std::cout << "Personal settings: '" << settings_path << "'\n";
        Json settings_json;
        personal_settings_file >> settings_json;
        this->parse_json(settings_json);
    }
    else
    {
        std::cout << "Could not open '"<< settings_path << "', will use default values.\n";
    }

    // Parse arguments from command line
    if(args.contains("ingametracker"))
        _add_ingame_item_tracker = args.get_boolean("ingametracker");

    if(args.contains("hudcolor"))
    {
        std::string hud_color_as_string = args.get_string("hudcolor");
        _hud_color = parse_color_from_name_or_hex(hud_color_as_string);
    }

    if(args.contains("nigelcolor"))
    {
        std::string nigel_color_as_string = args.get_string("nigelcolor");
        _nigel_colors.first = parse_color_from_name_or_hex(nigel_color_as_string);
        _nigel_colors.second = _nigel_colors.first.subtract(0x40);
    }
}